

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool AddLocal(CNetAddr *addr,int nScore)

{
  bool bVar1;
  uint16_t portIn;
  long in_FS_OFFSET;
  CService CStack_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  portIn = GetListenPort();
  CService::CService(&CStack_48,addr,portIn);
  bVar1 = AddLocal(&CStack_48,nScore);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&CStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool AddLocal(const CNetAddr &addr, int nScore)
{
    return AddLocal(CService(addr, GetListenPort()), nScore);
}